

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageMinus(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint uVar7;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar8;
  Oop selector;
  double dVar9;
  ulong uVar10;
  double dVar11;
  uint uVar12;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar3 = (undefined8 *)*puVar2;
  puVar4 = (undefined8 *)puVar2[1];
  uVar7 = (uint)puVar3;
  uVar12 = (uint)puVar4;
  if ((uVar7 & uVar12 & 1) == 0) {
    if ((uVar7 & 7) == 2 && (uVar12 & 7) == 2) {
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
      puVar2[1] = (long)(int)(uVar12 - (uVar7 & 0xfffffff8));
      return;
    }
    if ((((((ulong)puVar4 & 1) == 0) && ((uVar12 & 6) != 4)) &&
        ((((ulong)puVar4 & 6) != 0 || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22)))) ||
       (((((ulong)puVar3 & 1) == 0 && ((uVar7 & 6) != 4)) &&
        ((((ulong)puVar3 & 6) != 0 || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22)))))) {
      selector = VMContext::getSpecialMessageSelector(this->context,Minus);
      sendSelectorArgumentCount(this,selector,1,false);
      return;
    }
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
    if (((ulong)puVar4 & 1) == 0) {
      if ((uVar12 & 6) == 4) {
        uVar10 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
        dVar9 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
      }
      else {
        if ((((ulong)puVar4 & 6) != 0) || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22))
        goto LAB_00146e30;
        dVar9 = (double)puVar4[1];
      }
    }
    else {
      dVar9 = (double)((long)puVar4 >> 1);
    }
    if (((ulong)puVar3 & 1) == 0) {
      if ((uVar7 & 6) == 4) {
        uVar10 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
        dVar11 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
      }
      else {
        if ((((ulong)puVar3 & 6) != 0) || ((uint)((ulong)*puVar3 >> 0x2a) != 0x22)) {
LAB_00146e30:
          __assert_fail("isFloatOrInt()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                        ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
        }
        dVar11 = (double)puVar3[1];
      }
    }
    else {
      dVar11 = (double)((long)puVar3 >> 1);
    }
    aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::floatObjectFor(this->context,dVar9 - dVar11);
  }
  else {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
    aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::signedInt64ObjectFor(this->context,((long)puVar4 >> 1) - ((long)puVar3 >> 1))
    ;
  }
  puVar6 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar6 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar6 + -8) = aVar8;
  return;
}

Assistant:

void interpretSpecialMessageMinus()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushIntegerObject(ia - ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca - cb));
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa - fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Minus, 1);
        }
    }